

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall
cmdline::parser::
option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~option_with_value
          (option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  (this->super_option_base)._vptr_option_base = (_func_int **)&PTR__option_with_value_001cc868;
  std::__cxx11::string::~string((string *)&this->actual);
  std::__cxx11::string::~string((string *)&this->def);
  std::__cxx11::string::~string((string *)&this->desc);
  std::__cxx11::string::~string((string *)&this->nam);
  option_base::~option_base(&this->super_option_base);
  return;
}

Assistant:

~option_with_value(){}